

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StringAggDeserialize(Deserializer *deserializer,AggregateFunction *bound_function)

{
  undefined8 local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  
  Deserializer::ReadProperty<std::__cxx11::string>
            (&sep,(Deserializer *)bound_function,100,"separator");
  make_uniq<duckdb::StringAggBindData,std::__cxx11::string>((duckdb *)&local_38,&sep);
  *(undefined8 *)deserializer = local_38;
  std::__cxx11::string::~string((string *)&sep);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> StringAggDeserialize(Deserializer &deserializer, AggregateFunction &bound_function) {
	auto sep = deserializer.ReadProperty<string>(100, "separator");
	return make_uniq<StringAggBindData>(std::move(sep));
}